

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleinterp.cpp
# Opt level: O0

void __thiscall BrainFuckInterpreter::~BrainFuckInterpreter(BrainFuckInterpreter *this)

{
  BrainFuckInterpreter *this_local;
  
  if (this->tape_ != (uint8_t *)0x0) {
    operator_delete__(this->tape_);
  }
  BrainFuckProgram::~BrainFuckProgram(&this->p_);
  return;
}

Assistant:

~BrainFuckInterpreter() {
        delete []tape_;
    }